

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedPumpFrom>::
reject(AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedPumpFrom>
       *this,Exception *exception)

{
  ExceptionOr<kj::_::Void> EStack_1b8;
  
  if (this->waiting == true) {
    this->waiting = false;
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&EStack_1b8,exception);
    EStack_1b8.value.ptr.isSet = false;
    ExceptionOr<kj::_::Void>::operator=(&this->result,&EStack_1b8);
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&EStack_1b8);
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }